

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O0

Vector3D * __thiscall
CMU462::UniformHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,UniformHemisphereSampler3D *this)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double zs;
  double ys;
  double xs;
  double phi;
  double theta;
  double Xi2;
  double Xi1;
  UniformHemisphereSampler3D *this_local;
  
  iVar1 = rand();
  iVar2 = rand();
  dVar8 = acos((double)iVar1 / 2147483647.0);
  fVar6 = ((float)iVar2 / 2.1474836e+09) * 6.2831855;
  fVar3 = sinf((float)dVar8);
  fVar4 = cosf(fVar6);
  fVar5 = sinf((float)dVar8);
  fVar6 = sinf(fVar6);
  fVar7 = cosf((float)dVar8);
  Vector3D::Vector3D(__return_storage_ptr__,(double)(fVar3 * fVar4),(double)(fVar5 * fVar6),
                     (double)fVar7);
  return __return_storage_ptr__;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

    double Xi1 = (double)(std::rand()) / RAND_MAX;
    double Xi2 = (double)(std::rand()) / RAND_MAX;

    double theta = acos(Xi1);
    double phi = 2.0 * PI * Xi2;

    double xs = sinf(theta) * cosf(phi);
    double ys = sinf(theta) * sinf(phi);
    double zs = cosf(theta);

    return Vector3D(xs, ys, zs);

  }